

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

int ConvexDecomposition::maxdirsterid<ConvexDecomposition::float3>
              (float3 *p,int count,float3 *dir,Array<int> *allow)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar19 [64];
  float fVar21;
  undefined1 in_ZMM1 [64];
  undefined1 auVar22 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float3 fVar26;
  float3 local_88;
  float local_7c;
  float local_78;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  undefined1 auVar20 [56];
  undefined1 auVar23 [60];
  
  while( true ) {
    auVar23 = in_ZMM1._4_60_;
    auVar20 = in_ZMM0._8_56_;
    uVar9 = maxdirfiltered<ConvexDecomposition::float3>(p,count,dir,allow);
    if (((int)uVar9 < 0) || (allow->count <= (int)uVar9)) break;
    if (allow->element[uVar9] == 3) {
      return uVar9;
    }
    fVar26 = orth(dir);
    auVar22._0_4_ = fVar26.z;
    auVar22._4_60_ = auVar23;
    auVar19._0_8_ = fVar26._0_8_;
    auVar19._8_56_ = auVar20;
    _local_48 = auVar19._0_16_;
    auVar13 = vshufps_avx(_local_48,_local_48,0xe1);
    auVar6 = vmovshdup_avx(_local_48);
    uVar3._0_4_ = dir->y;
    uVar3._4_4_ = dir->z;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar3;
    local_58 = auVar22._0_16_;
    auVar14 = vinsertps_avx(auVar13,local_58,0x10);
    auVar25._0_4_ = (float)(undefined4)uVar3 * auVar22._0_4_;
    auVar25._4_4_ = (float)uVar3._4_4_ * auVar13._4_4_;
    auVar25._8_4_ = auVar13._8_4_ * 0.0;
    auVar25._12_4_ = auVar13._12_4_ * 0.0;
    auVar6 = vfmsub231ss_fma(ZEXT416((uint)(dir->x * auVar6._0_4_)),_local_48,auVar24);
    in_ZMM1 = ZEXT864(0) << 0x20;
    auVar13 = vpermt2ps_avx512vl(auVar24,_DAT_009d86b0,ZEXT416((uint)dir->x));
    _local_68 = vfmsub213ps_fma(auVar13,auVar14,auVar25);
    uVar12 = 0xffffffff;
    do {
      fVar21 = in_ZMM1._0_4_;
      local_78 = sinf(fVar21 * 0.017453292);
      fVar15 = cosf(fVar21 * 0.017453292);
      local_88.z = (local_78 * (float)local_58._0_4_ + fVar15 * auVar6._0_4_) * 0.025 + dir->z;
      auVar13._0_4_ = local_78 * (float)local_48._0_4_ + fVar15 * (float)local_68._0_4_;
      auVar13._4_4_ = local_78 * (float)local_48._4_4_ + fVar15 * (float)local_68._4_4_;
      auVar13._8_4_ = local_78 * fStack_40 + fVar15 * fStack_60;
      auVar13._12_4_ = local_78 * fStack_3c + fVar15 * fStack_5c;
      auVar14._8_4_ = 0x3ccccccd;
      auVar14._0_8_ = 0x3ccccccd3ccccccd;
      auVar14._12_4_ = 0x3ccccccd;
      auVar14 = vmulps_avx512vl(auVar13,auVar14);
      uVar1 = dir->x;
      uVar4 = dir->y;
      auVar16._0_4_ = (float)uVar1 + auVar14._0_4_;
      auVar16._4_4_ = (float)uVar4 + auVar14._4_4_;
      auVar16._8_4_ = auVar14._8_4_ + 0.0;
      auVar16._12_4_ = auVar14._12_4_ + 0.0;
      local_88._0_8_ = vmovlps_avx(auVar16);
      uVar10 = maxdirfiltered<ConvexDecomposition::float3>(p,count,&local_88,allow);
      if (uVar10 == uVar9 && uVar12 == uVar9) {
LAB_00909405:
        if ((int)uVar9 < allow->count) {
          allow->element[uVar9] = 3;
          return uVar9;
        }
        goto LAB_00909428;
      }
      fVar15 = local_7c;
      if ((uVar12 != 0xffffffff) && (fVar8 = fVar21 + -40.0, uVar12 != uVar10)) {
        while (local_7c = fVar8, local_7c <= fVar21) {
          fVar15 = local_7c * 0.017453292;
          local_78 = sinf(fVar15);
          fVar15 = cosf(fVar15);
          local_88.z = (local_78 * (float)local_58._0_4_ + fVar15 * auVar6._0_4_) * 0.025 + dir->z;
          auVar17._0_4_ = local_78 * (float)local_48._0_4_ + fVar15 * (float)local_68._0_4_;
          auVar17._4_4_ = local_78 * (float)local_48._4_4_ + fVar15 * (float)local_68._4_4_;
          auVar17._8_4_ = local_78 * fStack_40 + fVar15 * fStack_60;
          auVar17._12_4_ = local_78 * fStack_3c + fVar15 * fStack_5c;
          auVar7._8_4_ = 0x3ccccccd;
          auVar7._0_8_ = 0x3ccccccd3ccccccd;
          auVar7._12_4_ = 0x3ccccccd;
          auVar14 = vmulps_avx512vl(auVar17,auVar7);
          uVar2 = dir->x;
          uVar5 = dir->y;
          auVar18._0_4_ = (float)uVar2 + auVar14._0_4_;
          auVar18._4_4_ = (float)uVar5 + auVar14._4_4_;
          auVar18._8_4_ = auVar14._8_4_ + 0.0;
          auVar18._12_4_ = auVar14._12_4_ + 0.0;
          local_88._0_8_ = vmovlps_avx(auVar18);
          uVar11 = maxdirfiltered<ConvexDecomposition::float3>(p,count,&local_88,allow);
          if (uVar11 == uVar9 && uVar12 == uVar9) goto LAB_00909405;
          uVar12 = uVar11;
          fVar15 = local_7c;
          fVar8 = local_7c + 5.0;
        }
      }
      local_7c = fVar15;
      in_ZMM1 = ZEXT464((uint)(fVar21 + 45.0));
      in_ZMM0 = ZEXT464(0x43b40000);
      uVar12 = uVar10;
    } while (fVar21 + 45.0 <= 360.0);
    if (allow->count <= (int)uVar9) break;
    allow->element[uVar9] = 0;
  }
LAB_00909428:
  __assert_fail("i>=0 && i<count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x577,"Type &ConvexDecomposition::Array<int>::operator[](int) [Type = int]");
}

Assistant:

int maxdirsterid(const T *p,int count,const T &dir,Array<int> &allow)
{
	int m=-1;
	while(m==-1)
	{
		m = maxdirfiltered(p,count,dir,allow);
		if(allow[m]==3) return m;
		T u = orth(dir);
		T v = cross(u,dir);
		int ma=-1;
		for(float x = 0.0f ; x<= 360.0f ; x+= 45.0f)
		{
			float s = sinf(DEG2RAD*(x));
			float c = cosf(DEG2RAD*(x));
			int mb = maxdirfiltered(p,count,dir+(u*s+v*c)*0.025f,allow);
			if(ma==m && mb==m)
			{
				allow[m]=3;
				return m;
			}
			if(ma!=-1 && ma!=mb)  // Yuck - this is really ugly
			{
				int mc = ma;
				for(float xx = x-40.0f ; xx <= x ; xx+= 5.0f)
				{
					float s = sinf(DEG2RAD*(xx));
					float c = cosf(DEG2RAD*(xx));
					int md = maxdirfiltered(p,count,dir+(u*s+v*c)*0.025f,allow);
					if(mc==m && md==m)
					{
						allow[m]=3;
						return m;
					}
					mc=md;
				}
			}
			ma=mb;
		}
		allow[m]=0;
		m=-1;
	}
	assert(0);
	return m;
}